

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::copy_xpath_variable(xpath_variable *lhs,xpath_variable *rhs)

{
  xpath_value_type xVar1;
  xpath_variable *in_RSI;
  xpath_variable *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  xVar1 = xpath_variable::type(in_RSI);
  switch((xpath_node_set *)(ulong)(xVar1 - xpath_type_node_set)) {
  case (xpath_node_set *)0x0:
    bVar2 = xpath_variable::set(in_RSI,(xpath_node_set *)(ulong)(xVar1 - xpath_type_node_set));
    break;
  case (xpath_node_set *)0x1:
    bVar2 = xpath_variable::set(in_RDI,*(double *)(in_RSI + 1));
    break;
  case (xpath_node_set *)0x2:
    bVar2 = xpath_variable::set((xpath_variable *)
                                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                (char_t *)in_RDI);
    break;
  case (xpath_node_set *)0x3:
    bVar2 = xpath_variable::set(in_RDI,(bool)((char)in_RSI[1]._type & xpath_type_node_set));
    break;
  default:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

PUGI__FN bool copy_xpath_variable(xpath_variable* lhs, const xpath_variable* rhs)
	{
		switch (rhs->type())
		{
		case xpath_type_node_set:
			return lhs->set(static_cast<const xpath_variable_node_set*>(rhs)->value);

		case xpath_type_number:
			return lhs->set(static_cast<const xpath_variable_number*>(rhs)->value);

		case xpath_type_string:
			return lhs->set(static_cast<const xpath_variable_string*>(rhs)->value);

		case xpath_type_boolean:
			return lhs->set(static_cast<const xpath_variable_boolean*>(rhs)->value);

		default:
			assert(false && "Invalid variable type"); // unreachable
			return false;
		}
	}